

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_mul_mat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  bool bVar1;
  _Bool _Var2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int ne [4];
  _Bool is_node;
  ggml_tensor *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar5;
  
  _Var2 = ggml_can_mul_mat(in_RSI,in_RDX);
  if (!_Var2) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xe4e,
            "ggml_can_mul_mat(a, b)");
    abort();
  }
  bVar1 = false;
  if ((in_RSI->grad != (ggml_tensor *)0x0) || (in_RDX->grad != (ggml_tensor *)0x0)) {
    bVar1 = true;
  }
  if (in_RSI->n_dims < in_RDX->n_dims) {
    iVar5 = in_RSI->n_dims;
  }
  else {
    iVar5 = in_RDX->n_dims;
  }
  pgVar3 = ggml_new_tensor((ggml_context *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                           (ggml_type)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                           (int)in_stack_ffffffffffffffa8,(int *)0x14c688);
  pgVar3->op = GGML_OP_MUL_MAT;
  if (bVar1) {
    pgVar4 = ggml_dup_tensor((ggml_context *)CONCAT44(iVar5,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8);
  }
  else {
    pgVar4 = (ggml_tensor *)0x0;
  }
  pgVar3->grad = pgVar4;
  pgVar3->src0 = in_RSI;
  pgVar3->src1 = in_RDX;
  return pgVar3;
}

Assistant:

struct ggml_tensor * ggml_mul_mat(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_mul_mat(a, b));

    bool is_node = false;

    if (a->grad || b->grad) {
        is_node = true;
    }

    const int ne[4] = { a->ne[1], b->ne[1], a->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, MIN(a->n_dims, b->n_dims), ne);

    result->op   = GGML_OP_MUL_MAT;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}